

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O3

void borg_flow_border(int y1,int x1,int y2,int x2,_Bool stop)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  lVar1 = (long)x1;
  if (y1 <= y2) {
    lVar4 = (long)y1 * 0xc6;
    lVar2 = lVar4 + lVar1;
    lVar4 = x2 + lVar4;
    iVar3 = (y2 - y1) + 1;
    do {
      borg_data_know->data[0][lVar2] = stop;
      borg_data_icky->data[0][lVar2] = stop;
      borg_data_know->data[0][lVar4] = stop;
      borg_data_icky->data[0][lVar4] = stop;
      lVar2 = lVar2 + 0xc6;
      lVar4 = lVar4 + 0xc6;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  if (x1 <= x2) {
    lVar2 = (long)y1 * 0xc6 + lVar1;
    lVar1 = (long)y2 * 0xc6 + lVar1;
    iVar3 = (x2 - x1) + 1;
    do {
      borg_data_know->data[0][lVar2] = stop;
      borg_data_icky->data[0][lVar2] = stop;
      borg_data_know->data[0][lVar1] = stop;
      borg_data_icky->data[0][lVar1] = stop;
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

static void borg_flow_border(int y1, int x1, int y2, int x2, bool stop)
{
    int x, y;

    /* Scan west/east edges */
    for (y = y1; y <= y2; y++) {
        /* Avoid/Clear west edge */
        borg_data_know->data[y][x1] = stop;
        borg_data_icky->data[y][x1] = stop;

        /* Avoid/Clear east edge */
        borg_data_know->data[y][x2] = stop;
        borg_data_icky->data[y][x2] = stop;
    }

    /* Scan north/south edges */
    for (x = x1; x <= x2; x++) {
        /* Avoid/Clear north edge */
        borg_data_know->data[y1][x] = stop;
        borg_data_icky->data[y1][x] = stop;

        /* Avoid/Clear south edge */
        borg_data_know->data[y2][x] = stop;
        borg_data_icky->data[y2][x] = stop;
    }
}